

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O2

void __thiscall Snake::Update(Snake *this,Snake *otherSnake)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined4 extraout_EAX;
  int iVar6;
  int iVar7;
  SDL_Point local_78;
  SDL_Point local_70;
  int local_68;
  int iStack_64;
  undefined8 uStack_60;
  Snake local_58;
  
  uVar1 = this->head_x;
  uVar3 = this->head_y;
  local_68 = (int)(float)uVar1;
  iStack_64 = (int)(float)uVar3;
  uStack_60 = 0;
  local_70.y = iStack_64;
  local_70.x = local_68;
  UpdateHead(this);
  uVar2 = this->head_x;
  uVar4 = this->head_y;
  local_78.y = (int)(float)uVar4;
  local_78.x = (int)(float)uVar2;
  iVar6 = -(uint)(local_68 == (int)(float)uVar2);
  iVar7 = -(uint)(iStack_64 == (int)(float)uVar4);
  auVar5._4_4_ = iVar6;
  auVar5._0_4_ = iVar6;
  auVar5._8_4_ = iVar7;
  auVar5._12_4_ = iVar7;
  iVar6 = movmskpd(extraout_EAX,auVar5);
  if (iVar6 != 3) {
    Snake(&local_58,otherSnake);
    UpdateBody(this,&local_78,&local_70,&local_58);
    std::_Vector_base<SDL_Point,_std::allocator<SDL_Point>_>::~_Vector_base
              (&local_58.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>);
  }
  return;
}

Assistant:

void Snake::Update(Snake otherSnake) {
  SDL_Point prev_cell{
      static_cast<int>(head_x),
      static_cast<int>(
          head_y)};  // We first capture the head's cell before updating.
  UpdateHead();
  SDL_Point current_cell{
      static_cast<int>(head_x),
      static_cast<int>(head_y)};  // Capture the head's cell after updating.

  // Update all of the body vector items if the snake head has moved to a new
  // cell.
  if (current_cell.x != prev_cell.x || current_cell.y != prev_cell.y) {
    UpdateBody(current_cell, prev_cell, otherSnake);
  }
}